

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O2

asn_enc_rval_t *
SET_OF_encode_der(asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *ptr,
                 int tag_mode,ber_tlv_tag_t tag,asn_app_consume_bytes_f *cb,void *app_key)

{
  asn_TYPE_member_s *paVar1;
  asn_TYPE_descriptor_s *paVar2;
  der_type_encoder_f *pdVar3;
  void *pvVar4;
  int iVar5;
  undefined8 *__base;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  size_t sVar10;
  long lVar11;
  undefined8 *puVar12;
  size_t __nmemb;
  size_t struct_length;
  ulong uVar13;
  ulong local_78;
  asn_enc_rval_t local_48;
  
  paVar1 = td->elements;
  paVar2 = paVar1->type;
  pdVar3 = paVar2->der_encoder;
  sVar10 = 1;
  struct_length = 0;
  for (lVar11 = 0; lVar11 < *(int *)((long)ptr + 8); lVar11 = lVar11 + 1) {
    pvVar4 = *(void **)(*ptr + lVar11 * 8);
    if (pvVar4 != (void *)0x0) {
      (*pdVar3)(__return_storage_ptr__,paVar2,pvVar4,0,paVar1->tag,(asn_app_consume_bytes_f *)0x0,
                (void *)0x0);
      uVar13 = __return_storage_ptr__->encoded;
      if (uVar13 == 0xffffffffffffffff) {
        return __return_storage_ptr__;
      }
      struct_length = struct_length + uVar13;
      if (sVar10 <= uVar13) {
        sVar10 = uVar13;
      }
    }
  }
  local_78 = der_write_tags(td,struct_length,tag_mode,1,tag,cb,app_key);
  if (local_78 != 0xffffffffffffffff) {
    uVar13 = struct_length + local_78;
    if ((cb == (asn_app_consume_bytes_f *)0x0) ||
       (uVar7 = (ulong)*(int *)((long)ptr + 8), uVar7 == 0)) {
      __return_storage_ptr__->encoded = uVar13;
    }
    else {
      __base = (undefined8 *)malloc(uVar7 * 0x18);
      if (__base == (undefined8 *)0x0) {
        __return_storage_ptr__->encoded = -1;
        __return_storage_ptr__->failed_type = td;
        goto LAB_001452fe;
      }
      puVar9 = __base + -3;
      __nmemb = 0;
      for (uVar8 = 0; (long)uVar8 < (long)(int)uVar7; uVar8 = uVar8 + 1) {
        pvVar4 = *(void **)(*ptr + uVar8 * 8);
        if (pvVar4 != (void *)0x0) {
          puVar12 = __base + __nmemb * 3;
          pvVar6 = malloc(sVar10);
          *puVar12 = pvVar6;
          if (pvVar6 == (void *)0x0) goto LAB_001453c3;
          puVar12[1] = 0;
          puVar12[2] = sVar10;
          (*pdVar3)(&local_48,paVar2,pvVar4,0,paVar1->tag,_el_addbytes,puVar12);
          __return_storage_ptr__->structure_ptr = local_48.structure_ptr;
          __return_storage_ptr__->encoded = local_48.encoded;
          __return_storage_ptr__->failed_type = local_48.failed_type;
          if (__return_storage_ptr__->encoded == -1) {
            for (; -1 < (int)uVar8; uVar8 = (ulong)((int)uVar8 - 1)) {
              free((void *)__base[(uVar8 & 0xffffffff) * 3]);
            }
            free(__base);
            return __return_storage_ptr__;
          }
          local_78 = local_78 + __return_storage_ptr__->encoded;
          __nmemb = __nmemb + 1;
          uVar7 = (ulong)*(uint *)((long)ptr + 8);
        }
        puVar9 = puVar9 + 3;
      }
      qsort(__base,__nmemb,0x18,_el_buf_cmp);
      sVar10 = 0;
      puVar9 = __base;
      if ((long)__nmemb < 1) {
        __nmemb = sVar10;
      }
      while( true ) {
        iVar5 = (int)sVar10;
        if (__nmemb == 0) break;
        sVar10 = 0xffffffff;
        if (iVar5 == 0) {
          iVar5 = (*cb)((void *)*puVar9,puVar9[1],app_key);
          sVar10 = (size_t)(uint)(iVar5 >> 0x1f);
        }
        free((void *)*puVar9);
        puVar9 = puVar9 + 3;
        __nmemb = __nmemb - 1;
      }
      free(__base);
      uVar7 = 0xffffffffffffffff;
      if (uVar13 == local_78) {
        uVar7 = uVar13;
      }
      __return_storage_ptr__->encoded = -(ulong)(iVar5 != 0) | uVar7;
    }
    __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
    __return_storage_ptr__->structure_ptr = (void *)0x0;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->encoded = -1;
  __return_storage_ptr__->failed_type = td;
LAB_001452fe:
  __return_storage_ptr__->structure_ptr = ptr;
  return __return_storage_ptr__;
LAB_001453c3:
  for (; 0 < (long)uVar8; uVar8 = uVar8 - 1) {
    free((void *)*puVar9);
    puVar9 = puVar9 + -3;
  }
  free(__base);
  __return_storage_ptr__->encoded = -1;
  __return_storage_ptr__->failed_type = td;
  goto LAB_001452fe;
}

Assistant:

asn_enc_rval_t
SET_OF_encode_der(asn_TYPE_descriptor_t *td, void *ptr,
	int tag_mode, ber_tlv_tag_t tag,
	asn_app_consume_bytes_f *cb, void *app_key) {
	asn_TYPE_member_t *elm = td->elements;
	asn_TYPE_descriptor_t *elm_type = elm->type;
	der_type_encoder_f *der_encoder = elm_type->der_encoder;
	asn_anonymous_set_ *list = _A_SET_FROM_VOID(ptr);
	size_t computed_size = 0;
	ssize_t encoding_size = 0;
	struct _el_buffer *encoded_els;
	ssize_t eels_count = 0;
	size_t max_encoded_len = 1;
	asn_enc_rval_t erval;
	int ret;
	int edx;

	ASN_DEBUG("Estimating size for SET OF %s", td->name);

	/*
	 * Gather the length of the underlying members sequence.
	 */
	for(edx = 0; edx < list->count; edx++) {
		void *memb_ptr = list->array[edx];
		if(!memb_ptr) continue;
		erval = der_encoder(elm_type, memb_ptr, 0, elm->tag, 0, 0);
		if(erval.encoded == -1)
			return erval;
		computed_size += erval.encoded;

		/* Compute maximum encoding's size */
		if(max_encoded_len < (size_t)erval.encoded)
			max_encoded_len = erval.encoded;
	}

	/*
	 * Encode the TLV for the sequence itself.
	 */
	encoding_size = der_write_tags(td, computed_size, tag_mode, 1, tag,
		cb, app_key);
	if(encoding_size == -1) {
		erval.encoded = -1;
		erval.failed_type = td;
		erval.structure_ptr = ptr;
		return erval;
	}
	computed_size += encoding_size;

	if(!cb || list->count == 0) {
		erval.encoded = computed_size;
		ASN__ENCODED_OK(erval);
	}

	/*
	 * DER mandates dynamic sorting of the SET OF elements
	 * according to their encodings. Build an array of the
	 * encoded elements.
	 */
	encoded_els = (struct _el_buffer *)MALLOC(
				list->count * sizeof(encoded_els[0]));
	if(encoded_els == NULL) {
		erval.encoded = -1;
		erval.failed_type = td;
		erval.structure_ptr = ptr;
		return erval;
	}

	ASN_DEBUG("Encoding members of %s SET OF", td->name);

	/*
	 * Encode all members.
	 */
	for(edx = 0; edx < list->count; edx++) {
		void *memb_ptr = list->array[edx];
		struct _el_buffer *encoded_el = &encoded_els[eels_count];

		if(!memb_ptr) continue;

		/*
		 * Prepare space for encoding.
		 */
		encoded_el->buf = (uint8_t *)MALLOC(max_encoded_len);
		if(encoded_el->buf) {
			encoded_el->length = 0;
			encoded_el->size = max_encoded_len;
		} else {
			for(edx--; edx >= 0; edx--)
				FREEMEM(encoded_els[edx].buf);
			FREEMEM(encoded_els);
			erval.encoded = -1;
			erval.failed_type = td;
			erval.structure_ptr = ptr;
			return erval;
		}

		/*
		 * Encode the member into the prepared space.
		 */
		erval = der_encoder(elm_type, memb_ptr, 0, elm->tag,
			_el_addbytes, encoded_el);
		if(erval.encoded == -1) {
			for(; edx >= 0; edx--)
				FREEMEM(encoded_els[edx].buf);
			FREEMEM(encoded_els);
			return erval;
		}
		encoding_size += erval.encoded;
		eels_count++;
	}

	/*
	 * Sort the encoded elements according to their encoding.
	 */
	qsort(encoded_els, eels_count, sizeof(encoded_els[0]), _el_buf_cmp);

	/*
	 * Report encoded elements to the application.
	 * Dispose of temporary sorted members table.
	 */
	ret = 0;
	for(edx = 0; edx < eels_count; edx++) {
		struct _el_buffer *encoded_el = &encoded_els[edx];
		/* Report encoded chunks to the application */
		if(ret == 0
		&& cb(encoded_el->buf, encoded_el->length, app_key) < 0)
			ret = -1;
		FREEMEM(encoded_el->buf);
	}
	FREEMEM(encoded_els);

	if(ret || computed_size != (size_t)encoding_size) {
		/*
		 * Standard callback failed, or
		 * encoded size is not equal to the computed size.
		 */
		erval.encoded = -1;
		erval.failed_type = td;
		erval.structure_ptr = ptr;
	} else {
		erval.encoded = computed_size;
	}

	ASN__ENCODED_OK(erval);
}